

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O3

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator*=(TPZSFMatrix<long_double> *this,longdouble value)

{
  int iVar1;
  int extraout_var;
  longdouble *plVar2;
  longdouble *plVar3;
  
  plVar3 = this->fElem;
  iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])();
  if (CONCAT44(extraout_var,iVar1) != 0 && -1 < extraout_var) {
    plVar2 = plVar3 + CONCAT44(extraout_var,iVar1);
    do {
      *plVar3 = *plVar3 * value;
      plVar3 = plVar3 + 1;
    } while (plVar3 < plVar2);
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return this;
}

Assistant:

TPZSFMatrix<TVar>  &
TPZSFMatrix<TVar> ::operator*=( TVar value )
{
	TVar *dst = fElem;
	TVar *end = &fElem[ Size() ];
	while ( dst < end )
		*dst++ *= value;
	this->fDecomposed = 0;
	return( *this );
}